

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O1

void __thiscall
GlobOpt::ArrayLowerBoundCheckHoistInfo::SetCompatibleBoundCheck
          (ArrayLowerBoundCheckHoistInfo *this,BasicBlock *compatibleBoundCheckBlock,
          StackSym *indexSym,int offset,ValueNumber indexValueNumber)

{
  code *pcVar1;
  bool bVar2;
  Loop *pLVar3;
  undefined4 *puVar4;
  
  pLVar3 = Loop(this);
  if (pLVar3 != (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x31,"(!Loop())","!Loop()");
    if (!bVar2) goto LAB_004a7b42;
    *puVar4 = 0;
  }
  if (compatibleBoundCheckBlock == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x32,"(compatibleBoundCheckBlock)","compatibleBoundCheckBlock");
    if (!bVar2) goto LAB_004a7b42;
    *puVar4 = 0;
  }
  if (indexSym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x33,"(indexSym)","indexSym");
    if (!bVar2) goto LAB_004a7b42;
    *puVar4 = 0;
  }
  if ((indexSym->field_0x1a & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x34,"(!indexSym->IsTypeSpec())","!indexSym->IsTypeSpec()");
    if (!bVar2) goto LAB_004a7b42;
    *puVar4 = 0;
  }
  if (indexValueNumber == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x35,"(indexValueNumber != InvalidValueNumber)",
                       "indexValueNumber != InvalidValueNumber");
    if (!bVar2) {
LAB_004a7b42:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this->compatibleBoundCheckBlock = compatibleBoundCheckBlock;
  this->indexSym = indexSym;
  this->offset = offset;
  this->indexValueNumber = indexValueNumber;
  return;
}

Assistant:

void GlobOpt::ArrayLowerBoundCheckHoistInfo::SetCompatibleBoundCheck(
    BasicBlock *const compatibleBoundCheckBlock,
    StackSym *const indexSym,
    const int offset,
    const ValueNumber indexValueNumber)
{
    Assert(!Loop());
    Assert(compatibleBoundCheckBlock);
    Assert(indexSym);
    Assert(!indexSym->IsTypeSpec());
    Assert(indexValueNumber != InvalidValueNumber);

    this->compatibleBoundCheckBlock = compatibleBoundCheckBlock;
    this->indexSym = indexSym;
    this->offset = offset;
    this->indexValueNumber = indexValueNumber;
}